

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientMonitor.cpp
# Opt level: O2

int __thiscall ClientMonitor::findClientBy(ClientMonitor *this,string *username)

{
  pointer ppCVar1;
  __type _Var2;
  undefined8 *puVar3;
  int i;
  ulong uVar4;
  string sStack_48;
  
  uVar4 = 0;
  while( true ) {
    ppCVar1 = (this->clients).super__Vector_base<Client_*,_std::allocator<Client_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->clients).super__Vector_base<Client_*,_std::allocator<Client_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3) <= uVar4) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = &PTR__exception_001c3910;
      __cxa_throw(puVar3,&ClientNotFound::typeinfo,std::exception::~exception);
    }
    Client::getUsername_abi_cxx11_(&sStack_48,ppCVar1[uVar4]);
    _Var2 = std::operator==(&sStack_48,username);
    std::__cxx11::string::~string((string *)&sStack_48);
    if (_Var2) break;
    uVar4 = uVar4 + 1;
  }
  return (int)uVar4;
}

Assistant:

int ClientMonitor::findClientBy(const std::string& username) {
    for(int i = 0; i < clients.size(); i++){
        if(clients[i]->getUsername() == username){
            return i; // we want index instead of client pointer to easily remove clients (erase)
        }
    }
    throw ClientNotFound();
}